

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLinLin>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLinLin>
             *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  GetterXsYs<unsigned_long_long> *pGVar8;
  GetterXsYs<unsigned_long_long> *pGVar9;
  ImDrawVert *pIVar10;
  uint *puVar11;
  uint uVar12;
  ImPlotContext *gp;
  long lVar13;
  ImVec2 IVar14;
  double dVar15;
  ImVec2 IVar16;
  double dVar17;
  float fVar18;
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar29;
  undefined1 auVar28 [16];
  
  pGVar8 = this->Getter1;
  pGVar9 = this->Getter2;
  iVar5 = pGVar8->Count;
  lVar13 = (long)(((pGVar8->Offset + prim + 1) % iVar5 + iVar5) % iVar5) * (long)pGVar8->Stride;
  iVar5 = this->Transformer->YAxis;
  iVar6 = pGVar9->Count;
  uVar1 = *(ulong *)((long)pGVar8->Ys + lVar13);
  uVar2 = *(ulong *)((long)pGVar8->Xs + lVar13);
  IVar14 = GImPlot->PixelRange[iVar5].Min;
  dVar15 = (double)IVar14.x;
  dVar17 = (double)IVar14.y;
  dVar3 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  dVar4 = GImPlot->CurrentPlot->YAxis[iVar5].Range.Min;
  lVar13 = (long)(((prim + 1 + pGVar9->Offset) % iVar6 + iVar6) % iVar6) * (long)pGVar9->Stride;
  IVar14.x = (float)(((((double)(uVar2 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                      (double)(uVar2 & 0xffffffff | 0x4330000000000000)) - dVar3) * GImPlot->Mx +
                    dVar15);
  IVar14.y = (float)(((((double)(uVar1 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                      (double)(uVar1 & 0xffffffff | 0x4330000000000000)) - dVar4) *
                     GImPlot->My[iVar5] + dVar17);
  uVar1 = *(ulong *)((long)pGVar9->Ys + lVar13);
  uVar2 = *(ulong *)((long)pGVar9->Xs + lVar13);
  IVar16.x = (float)(((((double)(uVar2 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                      (double)(uVar2 & 0xffffffff | 0x4330000000000000)) - dVar3) * GImPlot->Mx +
                    dVar15);
  IVar16.y = (float)(((((double)(uVar1 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                      (double)(uVar1 & 0xffffffff | 0x4330000000000000)) - dVar4) *
                     GImPlot->My[iVar5] + dVar17);
  fVar20 = (this->P12).x;
  fVar21 = (this->P12).y;
  fVar23 = (this->P11).x;
  fVar29 = (this->P11).y;
  fVar18 = IVar14.y * fVar23 - IVar14.x * fVar29;
  fVar24 = fVar20 * IVar16.y - fVar21 * IVar16.x;
  fVar23 = fVar23 - IVar14.x;
  fVar20 = fVar20 - IVar16.x;
  fVar22 = fVar21 - IVar16.y;
  auVar25._4_4_ = fVar22;
  auVar25._0_4_ = fVar22;
  auVar25._8_4_ = fVar22;
  auVar25._12_4_ = fVar22;
  auVar26._4_12_ = auVar25._4_12_;
  auVar26._0_4_ = fVar22 * fVar23 - (fVar29 - IVar14.y) * fVar20;
  auVar19._0_4_ = fVar18 * fVar20 - fVar24 * fVar23;
  auVar19._4_4_ = fVar18 * fVar22 - fVar24 * (fVar29 - IVar14.y);
  auVar19._8_4_ = IVar14.y * 0.0 - fVar21 * 0.0;
  auVar19._12_4_ = IVar14.y * 0.0 - fVar21 * 0.0;
  auVar28._0_8_ = auVar26._0_8_;
  auVar28._8_4_ = fVar22;
  auVar28._12_4_ = fVar22;
  auVar27._8_8_ = auVar28._8_8_;
  auVar27._4_4_ = auVar26._0_4_;
  auVar27._0_4_ = auVar26._0_4_;
  auVar19 = divps(auVar19,auVar27);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10->col = this->Col;
  pIVar10[1].pos = IVar14;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10[1].col = this->Col;
  pIVar10[2].pos = auVar19._0_8_;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10[2].col = this->Col;
  pIVar10[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10[3].col = this->Col;
  pIVar10[4].pos = IVar16;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar10 + 5;
  uVar7 = DrawList->_VtxCurrentIdx;
  puVar11 = DrawList->_IdxWritePtr;
  *puVar11 = uVar7;
  uVar12 = -(uint)(IVar14.y < IVar16.y && fVar21 < fVar29 || IVar16.y < IVar14.y && fVar29 < fVar21)
           & 1;
  puVar11[1] = uVar7 + uVar12 + 1;
  puVar11[2] = DrawList->_VtxCurrentIdx + 3;
  puVar11[3] = DrawList->_VtxCurrentIdx + 1;
  puVar11[4] = (uVar12 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar11[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar11 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  this->P11 = IVar14;
  this->P12 = IVar16;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }